

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_common.cpp
# Opt level: O1

int CfdEncodeBase64(void *handle,char *buffer,char **output)

{
  pointer pcVar1;
  size_t sVar2;
  char *pcVar3;
  CfdException *pCVar4;
  ByteData *extraout_RDX;
  ByteData *extraout_RDX_00;
  ByteData *data_00;
  string base64;
  ByteData data;
  undefined1 local_68 [32];
  ByteData local_48;
  
  cfd::Initialize();
  if (buffer == (char *)0x0) {
    local_68._0_8_ = "cfdcapi_common.cpp";
    local_68._8_4_ = 0x32e;
    local_68._16_8_ = "CfdEncodeBase64";
    cfd::core::logger::log<>((CfdSourceLocation *)local_68,kCfdLogLevelWarning,"buffer is null.");
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    local_68._0_8_ = local_68 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_68,"Failed to parameter. buffer is null.","");
    cfd::core::CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)local_68);
    __cxa_throw(pCVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (output != (char **)0x0) {
    pcVar1 = local_68 + 0x10;
    local_68._0_8_ = pcVar1;
    sVar2 = strlen(buffer);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_68,buffer,buffer + sVar2);
    cfd::core::ByteData::ByteData(&local_48,(string *)local_68);
    data_00 = extraout_RDX;
    if ((pointer)local_68._0_8_ != pcVar1) {
      operator_delete((void *)local_68._0_8_);
      data_00 = extraout_RDX_00;
    }
    cfd::core::CryptoUtil::EncodeBase64_abi_cxx11_
              ((string *)local_68,(CryptoUtil *)&local_48,data_00);
    pcVar3 = cfd::capi::CreateString((string *)local_68);
    *output = pcVar3;
    if ((pointer)local_68._0_8_ != pcVar1) {
      operator_delete((void *)local_68._0_8_);
    }
    if (local_48.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_48.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    return 0;
  }
  local_68._0_8_ = "cfdcapi_common.cpp";
  local_68._8_4_ = 0x334;
  local_68._16_8_ = "CfdEncodeBase64";
  cfd::core::logger::log<>((CfdSourceLocation *)local_68,kCfdLogLevelWarning,"output is null.");
  pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
  local_68._0_8_ = local_68 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_68,"Failed to parameter. output is null.","");
  cfd::core::CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)local_68);
  __cxa_throw(pCVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdEncodeBase64(
    void* handle, const char* buffer, char** output) {
  try {
    cfd::Initialize();
    if (buffer == nullptr) {
      warn(CFD_LOG_SOURCE, "buffer is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. buffer is null.");
    }
    if (output == nullptr) {
      warn(CFD_LOG_SOURCE, "output is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. output is null.");
    }
    ByteData data(buffer);
    auto base64 = cfd::core::CryptoUtil::EncodeBase64(data);
    *output = cfd::capi::CreateString(base64);
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return cfd::capi::SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    cfd::capi::SetLastFatalError(handle, std_except.what());
  } catch (...) {
    cfd::capi::SetLastFatalError(handle, "unknown error.");
  }
  return CfdErrorCode::kCfdUnknownError;
}